

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::RemoveAt(CopyRemovePolicy<JsUtil::List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
           *this,List<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 *list,int index)

{
  Type pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  int iVar6;
  
  if ((index < 0) ||
     ((list->
      super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
      ).count <= index)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/List.h"
                                ,0x2ee,"(index >= 0 && index < list->count)",
                                "index >= 0 && index < list->count");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  lVar5 = (long)(index + 1) << 4;
  while( true ) {
    iVar6 = (list->
            super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
            ).count;
    if (iVar6 <= index + 1) break;
    pSVar1 = (list->
             super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
             ).buffer;
    pSVar1[index].beginCodeSpan = *(int *)((long)&pSVar1->beginCodeSpan + lVar5);
    pSVar1[index].node = *(ParseNode **)((long)&pSVar1->node + lVar5);
    lVar5 = lVar5 + 0x10;
    index = index + 1;
  }
  iVar6 = iVar6 + -1;
  (list->
  super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
  ).count = iVar6;
  pSVar1 = (list->
           super_ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
           ).buffer + iVar6;
  pSVar1->node = (ParseNode *)0x0;
  *(undefined8 *)&pSVar1->beginCodeSpan = 0;
  return;
}

Assistant:

void RemoveAt(TListType* list, int index)
        {
            Assert(index >= 0 && index < list->count);
            for (int j = index + 1; j < list->count; index++, j++)
            {
                list->buffer[index] = list->buffer[j];
            }
            list->count--;

            if (clearOldEntries)
            {
                ClearArray(list->buffer + list->count, 1);
            }
        }